

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectsource.cc
# Opt level: O2

Status * __thiscall
google::protobuf::util::converter::ProtoStreamObjectSource::RenderDuration
          (Status *__return_storage_ptr__,ProtoStreamObjectSource *this,ProtoStreamObjectSource *os,
          Type *type,StringPiece field_name,ObjectWriter *ow)

{
  int iVar1;
  undefined1 auVar2 [8];
  stringpiece_ssize_type sVar4;
  AlphaNum *b;
  char *pcVar5;
  string *this_00;
  ulong uVar6;
  StringPiece error_message;
  StringPiece error_message_00;
  StringPiece error_message_01;
  pair<long,_int> pVar7;
  undefined1 local_e8 [8];
  string formatted_duration;
  string local_b8;
  long *local_88;
  string local_80;
  undefined1 local_60 [8];
  string sign;
  long lVar3;
  
  local_88 = (long *)field_name.length_;
  pcVar5 = field_name.ptr_;
  pVar7 = ReadSecondsAndNanos(this,(Type *)os);
  lVar3 = pVar7.first;
  b = (AlphaNum *)0xffffff6d0c68c3fe;
  if (lVar3 - 0x4979cb9e01U < 0xffffff6d0c68c3ff) {
    local_b8._M_dataplus._M_p = "Duration seconds exceeds limit for field: ";
    local_b8._M_string_length = 0x2a;
    local_e8 = (undefined1  [8])type;
    formatted_duration._M_dataplus._M_p = pcVar5;
    StrCat_abi_cxx11_((string *)local_60,(protobuf *)&local_b8,(AlphaNum *)local_e8,
                      (AlphaNum *)0xffffff6d0c68c3fe);
    sVar4 = StringPiece::CheckedSsizeTFromSizeT((size_t)sign._M_dataplus._M_p);
    error_message.length_ = sVar4;
    error_message.ptr_ = (char *)local_60;
    Status::Status(__return_storage_ptr__,INTERNAL,error_message);
    goto LAB_00334cd6;
  }
  iVar1 = pVar7.second;
  sign.field_2._8_8_ = pcVar5;
  if (iVar1 + 0xc4653600U < 0x88ca6c01) {
    local_b8._M_dataplus._M_p = "Duration nanos exceeds limit for field: ";
    local_b8._M_string_length = 0x28;
    local_e8 = (undefined1  [8])type;
    formatted_duration._M_dataplus._M_p = pcVar5;
    StrCat_abi_cxx11_((string *)local_60,(protobuf *)&local_b8,(AlphaNum *)local_e8,
                      (AlphaNum *)0xffffff6d0c68c3fe);
    sVar4 = StringPiece::CheckedSsizeTFromSizeT((size_t)sign._M_dataplus._M_p);
    error_message_00.length_ = sVar4;
    error_message_00.ptr_ = (char *)local_60;
    Status::Status(__return_storage_ptr__,INTERNAL,error_message_00);
    goto LAB_00334cd6;
  }
  std::__cxx11::string::string((string *)local_60,"",(allocator *)&local_b8);
  if (lVar3 < 0) {
    if (iVar1 < 1) {
      std::__cxx11::string::assign(local_60);
      pVar7.second = -iVar1;
      pVar7.first = -lVar3;
      pVar7._12_4_ = 0;
      goto LAB_00334bc3;
    }
    local_b8._M_dataplus._M_p =
         "Duration nanos is non-negative, but seconds is negative for field: ";
    local_b8._M_string_length = 0x43;
    formatted_duration._M_dataplus._M_p = (pointer)sign.field_2._8_8_;
    local_e8 = (undefined1  [8])type;
    StrCat_abi_cxx11_(&local_80,(protobuf *)&local_b8,(AlphaNum *)local_e8,b);
    sVar4 = StringPiece::CheckedSsizeTFromSizeT(local_80._M_string_length);
    error_message_01.length_ = sVar4;
    error_message_01.ptr_ = local_80._M_dataplus._M_p;
    Status::Status(__return_storage_ptr__,INTERNAL,error_message_01);
    this_00 = &local_80;
  }
  else {
    if (iVar1 < 0 && lVar3 == 0) {
      std::__cxx11::string::assign(local_60);
      pVar7 = (pair<long,_int>)(ZEXT416((uint)-iVar1) << 0x40);
LAB_00334bcc:
      uVar6 = pVar7._8_8_;
      lVar3 = pVar7.first;
      if ((int)((uVar6 & 0xffffffff) % 1000) == 0) {
        pcVar5 = "%.6f";
        if ((int)((uVar6 & 0xffffffff) % 1000000) == 0) {
          pcVar5 = "%.3f";
        }
      }
      else {
        pcVar5 = "%.9f";
      }
      StringPrintf_abi_cxx11_(&local_b8,pcVar5,(double)(uVar6 & 0xffffffff) / 1000000000.0);
      std::__cxx11::string::substr((ulong)&local_80,(ulong)&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
    }
    else {
LAB_00334bc3:
      lVar3 = pVar7.first;
      if (pVar7.second != 0) goto LAB_00334bcc;
      pcVar5 = "";
      if (this->add_trailing_zeros_for_timestamp_and_duration_ != false) {
        pcVar5 = ".000";
      }
      std::__cxx11::string::string((string *)&local_80,pcVar5,(allocator *)&local_b8);
    }
    StringPrintf_abi_cxx11_((string *)local_e8,"%s%lld%ss",local_60,lVar3,local_80._M_dataplus._M_p)
    ;
    std::__cxx11::string::~string((string *)&local_80);
    auVar2 = local_e8;
    sVar4 = StringPiece::CheckedSsizeTFromSizeT((size_t)formatted_duration._M_dataplus._M_p);
    (**(code **)(*local_88 + 0x68))(local_88,type,sign.field_2._8_8_,auVar2,sVar4);
    Status::Status(__return_storage_ptr__);
    this_00 = (string *)local_e8;
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_00334cd6:
  std::__cxx11::string::~string((string *)local_60);
  return __return_storage_ptr__;
}

Assistant:

Status ProtoStreamObjectSource::RenderDuration(
    const ProtoStreamObjectSource* os, const google::protobuf::Type& type,
    StringPiece field_name, ObjectWriter* ow) {
  std::pair<int64, int32> p = os->ReadSecondsAndNanos(type);
  int64 seconds = p.first;
  int32 nanos = p.second;
  if (seconds > kDurationMaxSeconds || seconds < kDurationMinSeconds) {
    return Status(
        util::error::INTERNAL,
        StrCat("Duration seconds exceeds limit for field: ", field_name));
  }

  if (nanos <= -kNanosPerSecond || nanos >= kNanosPerSecond) {
    return Status(
        util::error::INTERNAL,
        StrCat("Duration nanos exceeds limit for field: ", field_name));
  }

  std::string sign = "";
  if (seconds < 0) {
    if (nanos > 0) {
      return Status(
          util::error::INTERNAL,
          StrCat("Duration nanos is non-negative, but seconds is "
                       "negative for field: ",
                       field_name));
    }
    sign = "-";
    seconds = -seconds;
    nanos = -nanos;
  } else if (seconds == 0 && nanos < 0) {
    sign = "-";
    nanos = -nanos;
  }
  std::string formatted_duration = StringPrintf(
      "%s%lld%ss", sign.c_str(), static_cast<long long>(seconds),  // NOLINT
      FormatNanos(nanos, os->add_trailing_zeros_for_timestamp_and_duration_)
          .c_str());
  ow->RenderString(field_name, formatted_duration);
  return util::Status();
}